

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  char *__src;
  char cVar1;
  byte closure_char;
  short sVar2;
  pointer pCVar3;
  size_t __n;
  pointer pcVar4;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *pvVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  istream *piVar9;
  size_type sVar10;
  void *pvVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  undefined8 extraout_RAX;
  undefined7 uVar13;
  undefined8 extraout_RAX_00;
  char cVar14;
  ulong __n_00;
  undefined8 uVar15;
  size_type __size;
  size_t __pos;
  pointer pbVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *str;
  undefined8 uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  ConfigBase *pCVar22;
  bool bVar23;
  string multiline;
  string item;
  string line;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string currentSection;
  string name;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it_1;
  string previousSection;
  string buffer;
  string line_sep_chars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  citems;
  undefined1 local_378 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  ConfigBase *local_338;
  undefined1 local_330 [32];
  undefined8 local_310;
  ulong local_308;
  uint local_2fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  int local_2dc;
  uint local_2d8;
  int local_2d4;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  int local_2ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  uint local_254;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  pointer local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  uint local_22c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  char *local_188;
  size_type local_180;
  char local_178;
  char cStack_177;
  char cStack_176;
  undefined1 uStack_175;
  undefined4 uStack_174;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [5];
  string local_d0 [2];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_330._0_8_ = local_330 + 0x10;
  local_330._8_8_ = 0;
  local_330[0x10] = '\0';
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"default","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"default","");
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = this->arrayStart;
  local_22c = (uint)cVar1;
  cVar6 = this->arrayEnd;
  if (cVar6 == ']' && cVar1 == '[') {
    local_2fc._0_1_ = this->arraySeparator == ',';
    local_2fc._1_3_ = (int3)(cVar1 >> 7);
  }
  else {
    local_2fc._0_1_ = false;
    local_2fc._1_3_ = 0;
  }
  local_2d4 = (int)cVar6;
  bVar23 = (local_22c & 0xdf) == 0;
  cVar7 = this->arraySeparator;
  cVar14 = ',';
  if (cVar7 != ' ') {
    cVar14 = cVar7;
  }
  if (bVar23 && cVar1 == cVar6) {
    local_22c = 0x5b;
    local_2d4 = 0x5d;
    cVar7 = cVar14;
  }
  local_178 = this->parentSeparatorChar;
  cStack_177 = this->commentChar;
  cStack_176 = this->valueDelimiter;
  local_188 = &local_178;
  local_180 = 3;
  uStack_175 = 0;
  local_2fc = CONCAT31(local_2fc._1_3_,local_2fc._0_1_ | (bVar23 && cVar1 == cVar6));
  local_2dc = (int)cVar7;
  local_2ac = 0;
  local_2d8 = 0;
  local_338 = this;
  local_2d0 = __return_storage_ptr__;
  do {
    pCVar22 = local_338;
    cVar1 = (char)input;
    cVar6 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
    piVar9 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input,(string *)&local_208,cVar6);
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_2a8,"default");
      pvVar5 = local_2d0;
      if (iVar8 != 0) {
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(local_2d0);
        detail::generate_parents
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_378,&local_2a8,&local_288,pCVar22->parentSeparatorChar);
        pCVar3 = (pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        local_358._M_allocated_capacity =
             (size_type)
             pCVar3[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_358._8_8_ =
             pCVar3[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_348._M_allocated_capacity =
             (size_type)
             pCVar3[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pCVar3[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_378._0_8_;
        pCVar3[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_378._8_8_;
        pCVar3[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_378._16_8_;
        local_378._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_378._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_378._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_358);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_378);
        pCVar3 = (pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&pCVar3[-1].name,0,pCVar3[-1].name._M_string_length,"--",2);
        pCVar3 = (pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar21 = (long)pCVar3[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pCVar3[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        while (0x20 < uVar21) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (pvVar5,pCVar3 + -1);
          pCVar3 = (pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          pbVar16 = pCVar3[-1].parents.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pCVar3[-1].parents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar16 + -1;
          pcVar4 = pbVar16[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &pbVar16[-1].field_2) {
            operator_delete(pcVar4,pbVar16[-1].field_2._M_allocated_capacity + 1);
          }
          pCVar3 = (pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar21 = (long)pCVar3[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pCVar3[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_188 != &local_178) {
        operator_delete(local_188,
                        CONCAT44(uStack_174,
                                 CONCAT13(uStack_175,
                                          CONCAT12(cStack_176,CONCAT11(cStack_177,local_178)))) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                 local_208.field_2._M_local_buf[0]) + 1);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_330 + 0x10)) {
        operator_delete((void *)local_330._0_8_,CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
      }
      return pvVar5;
    }
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    detail::trim_copy((string *)&local_358,&local_208);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_allocated_capacity != &local_348) {
      operator_delete((void *)local_358._M_allocated_capacity,
                      (ulong)(local_348._M_allocated_capacity + 1));
    }
    uVar15 = local_330._8_8_;
    if (2 < (ulong)local_330._8_8_) {
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330
                      ,0,3,"\"\"\"");
      if ((iVar8 == 0) ||
         (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_330,0,3,"\'\'\'"), iVar8 == 0)) {
        cVar6 = *(char *)local_330._0_8_;
        bVar23 = true;
        do {
          cVar7 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
          piVar9 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (input,(string *)local_330,cVar7);
          if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
          local_358._M_allocated_capacity = local_330._0_8_ + local_330._8_8_;
          local_378._0_8_ = local_330._0_8_;
          ::std::
          __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    (&local_2c8,&local_358,local_378);
          local_330._8_8_ =
               (long)local_2c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - local_330._0_8_;
          *(char *)local_2c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start = '\0';
          _Var12 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                             (local_330._0_8_,(char *)(local_330._0_8_ + local_330._8_8_));
          if ((char *)(local_330._0_8_ + local_330._8_8_) == _Var12._M_current) {
            local_330._8_8_ = 0;
            pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_330._0_8_;
          }
          else {
            sVar10 = (long)_Var12._M_current - local_330._0_8_;
            if ((local_330._8_8_ != sVar10 && sVar10 != 0) &&
               (sVar19 = local_330._8_8_ - sVar10, sVar19 != 0)) {
              if (sVar19 == 1) {
                *(char *)local_330._0_8_ = *(char *)(local_330._0_8_ + sVar10);
              }
              else {
                memmove((void *)local_330._0_8_,(char *)(local_330._0_8_ + sVar10),sVar19);
              }
            }
            local_330._8_8_ = local_330._8_8_ - sVar10;
            pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_330._0_8_ + local_330._8_8_);
          }
          *(char *)&(pbVar18->_M_dataplus)._M_p = '\0';
          if ((((2 < (ulong)local_330._8_8_) &&
               (*(char *)(local_330._0_8_ + (local_330._8_8_ - 1)) == cVar6)) &&
              (*(char *)(local_330._0_8_ + (local_330._8_8_ - 2)) == cVar6)) &&
             (*(char *)(local_330._0_8_ + (local_330._8_8_ - 3)) == cVar6)) {
            bVar23 = false;
          }
        } while (bVar23);
      }
      else {
        cVar6 = *(char *)local_330._0_8_;
        if ((cVar6 != '#') && (cVar6 != ';')) {
          if ((cVar6 == '[') && (*(char *)(local_330._0_8_ + (local_330._8_8_ - 1)) == ']')) {
            iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_2a8,"default");
            if (iVar8 != 0) {
              std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                        (local_2d0);
              detail::generate_parents
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_378,&local_2a8,&local_288,local_338->parentSeparatorChar);
              pvVar5 = local_2d0;
              pCVar3 = (local_2d0->
                       super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              local_358._M_allocated_capacity =
                   (size_type)
                   pCVar3[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_358._8_8_ =
                   pCVar3[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_348._M_allocated_capacity =
                   (size_type)
                   pCVar3[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pCVar3[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_378._0_8_;
              pCVar3[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_378._8_8_;
              pCVar3[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_378._16_8_;
              local_378._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_378._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_378._16_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_358);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_378);
              pCVar3 = (pvVar5->
                       super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(&pCVar3[-1].name,0,pCVar3[-1].name._M_string_length,"--",2);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_358,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330,1,uVar15 - 2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_2a8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_358);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_allocated_capacity != &local_348) {
              operator_delete((void *)local_358._M_allocated_capacity,
                              (ulong)(local_348._M_allocated_capacity + 1));
            }
            if (((1 < local_2a8._M_string_length) && (*local_2a8._M_dataplus._M_p == '[')) &&
               (local_2a8._M_dataplus._M_p[local_2a8._M_string_length - 1] == ']')) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_50,&local_2a8,1,local_2a8._M_string_length - 2);
              from_config();
            }
            local_250 = &local_240;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_250,local_2a8._M_dataplus._M_p,
                       local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_250,local_250->_M_local_buf + (long)&local_248->_M_dataplus,local_250);
            if (local_250 == &local_240) {
              local_348._8_8_ = local_240._8_8_;
              local_358._M_allocated_capacity = (size_type)&local_348;
            }
            else {
              local_358._M_allocated_capacity = (size_type)local_250;
            }
            local_348._M_allocated_capacity._1_7_ = local_240._M_allocated_capacity._1_7_;
            local_348._M_local_buf[0] = local_240._M_local_buf[0];
            local_358._8_8_ = local_248;
            local_248 = (pointer)0x0;
            local_240._M_local_buf[0] = '\0';
            local_250 = &local_240;
            iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_358,"default");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_allocated_capacity != &local_348) {
              operator_delete((void *)local_358._M_allocated_capacity,
                              (ulong)(local_348._M_allocated_capacity + 1));
            }
            if (local_250 != &local_240) {
              operator_delete(local_250,
                              CONCAT71(local_240._M_allocated_capacity._1_7_,
                                       local_240._M_local_buf[0]) + 1);
            }
            if (iVar8 == 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(&local_2a8,0,local_2a8._M_string_length,"default",7);
            }
            else {
              detail::checkParentSegments(local_2d0,&local_2a8,local_338->parentSeparatorChar);
            }
            if ((local_2a8._M_string_length == local_228._M_string_length) &&
               ((local_2a8._M_string_length == 0 ||
                (iVar8 = bcmp(local_2a8._M_dataplus._M_p,local_228._M_dataplus._M_p,
                              local_2a8._M_string_length), iVar8 == 0)))) {
              local_2ac = local_2ac + 1;
              local_2d8 = 0;
            }
            else {
              local_2ac = 0;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&local_228,&local_2a8);
              local_2d8 = 0;
            }
          }
          else if (cVar6 != local_338->commentChar) {
            sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_330,"\"\'`",0,3);
            __pos = 0;
            if (sVar10 != 0xffffffffffffffff) {
              __pos = 0;
              do {
                if ((ulong)local_330._8_8_ <= __pos) break;
                closure_char = *(byte *)(local_330._0_8_ + __pos);
                if ((closure_char - 0x22 < 0x3f) &&
                   ((0x4000000000000021U >> ((ulong)(closure_char - 0x22) & 0x3f) & 1) != 0)) {
                  __pos = detail::close_sequence((string *)local_330,__pos,closure_char);
LAB_00196643:
                  __pos = __pos + 1;
LAB_00196646:
                  bVar23 = true;
                }
                else {
                  if ((closure_char != local_338->valueDelimiter) &&
                     (closure_char != local_338->commentChar)) {
                    if (((closure_char == 9) || (closure_char == 0x20)) ||
                       (closure_char == local_338->parentSeparatorChar)) goto LAB_00196643;
                    __pos = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_330,local_188,__pos,local_180);
                    goto LAB_00196646;
                  }
                  __pos = __pos - 1;
                  bVar23 = false;
                }
              } while (bVar23);
            }
            uVar17 = local_330._8_8_;
            uVar15 = local_330._0_8_;
            uVar21 = __pos + 1;
            local_308 = 0xffffffffffffffff;
            __n_00 = 0xffffffffffffffff;
            if (uVar21 <= (ulong)local_330._8_8_ && local_330._8_8_ - uVar21 != 0) {
              pvVar11 = memchr((char *)(local_330._0_8_ + uVar21),(int)local_338->valueDelimiter,
                               local_330._8_8_ - uVar21);
              __n_00 = -(ulong)(pvVar11 == (void *)0x0) | (long)pvVar11 - uVar15;
            }
            uVar15 = local_330._0_8_;
            sVar19 = uVar17 - __pos;
            if (__pos <= (ulong)uVar17 && sVar19 != 0) {
              pvVar11 = memchr((char *)(local_330._0_8_ + __pos),(int)local_338->commentChar,sVar19)
              ;
              local_308 = -(ulong)(pvVar11 == (void *)0x0) | (long)pvVar11 - uVar15;
            }
            if ((__n_00 == 0xffffffffffffffff) || (local_308 < __n_00)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                     0,local_308);
              detail::trim_copy((string *)&local_358,(string *)local_378);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_288,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_358);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_allocated_capacity != &local_348) {
                operator_delete((void *)local_358._M_allocated_capacity,
                                (ulong)(local_348._M_allocated_capacity + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_378._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_378 + 0x10)) {
                operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
              }
              local_358._M_allocated_capacity = (size_type)&local_348;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"true","");
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_2f8,&local_358,&local_338);
              pCVar22 = local_338;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_allocated_capacity != &local_348) {
                operator_delete((void *)local_358._M_allocated_capacity,
                                (ulong)(local_348._M_allocated_capacity + 1));
                pCVar22 = local_338;
              }
            }
            else {
              local_310 = __n_00;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                     0,__n_00);
              detail::trim_copy((string *)&local_358,(string *)local_378);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_288,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_358);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_allocated_capacity != &local_348) {
                operator_delete((void *)local_358._M_allocated_capacity,
                                (ulong)(local_348._M_allocated_capacity + 1));
              }
              uVar21 = local_310;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_378._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_378 + 0x10)) {
                operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                     uVar21 + 1,0xffffffffffffffff);
              detail::trim_copy((string *)&local_358,(string *)local_378);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_378._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_378 + 0x10)) {
                operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
              }
              iVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_358,0,3,"\'\'\'");
              if (iVar8 == 0) {
                bVar23 = true;
              }
              else {
                iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_358,0,3,"\"\"\"");
                bVar23 = iVar8 == 0;
              }
              if (!(bool)(local_308 == 0xffffffffffffffff | bVar23)) {
                local_1a8._M_allocated_capacity = (size_type)&local_198;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1a8,local_358._M_allocated_capacity,
                           (char *)(local_358._8_8_ + local_358._M_allocated_capacity));
                detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_128,(string *)&local_1a8,local_338->commentChar);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_allocated_capacity != &local_198) {
                  operator_delete((void *)local_1a8._M_allocated_capacity,
                                  local_198._M_allocated_capacity + 1);
                }
                detail::trim_copy(&local_70,(string *)local_128[0]._0_8_);
                from_config();
              }
              uVar17 = local_358._8_8_;
              uVar15 = local_358._M_allocated_capacity;
              if (bVar23) {
                cVar6 = *(char *)local_358._M_allocated_capacity;
                uVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0xffffffffffffffff;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378,&local_208,uVar21 + 1,0xffffffffffffffff);
                from_config();
                _Var12 = ::std::
                         __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                   ();
                if ((char *)(local_358._M_allocated_capacity + local_358._8_8_) == _Var12._M_current
                   ) {
                  local_358._8_8_ = (pointer)0x0;
                  uVar17 = local_358._M_allocated_capacity;
                }
                else {
                  pbVar16 = (pointer)(_Var12._M_current + -local_358._M_allocated_capacity);
                  uVar15 = uVar15 & 0xffffffffffffff00;
                  if (((pointer)local_358._8_8_ != pbVar16 && pbVar16 != (pointer)0x0) &&
                     (sVar19 = local_358._8_8_ - (long)pbVar16, sVar19 != 0)) {
                    __src = (char *)((long)&(pbVar16->_M_dataplus)._M_p +
                                    local_358._M_allocated_capacity);
                    if (sVar19 == 1) {
                      *(char *)local_358._M_allocated_capacity = *__src;
                    }
                    else {
                      memmove((void *)local_358._M_allocated_capacity,__src,sVar19);
                    }
                  }
                  local_358._8_8_ = local_358._8_8_ - (long)pbVar16;
                  uVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)((long)&(((pointer)local_358._8_8_)->_M_dataplus)._M_p +
                              local_358._M_allocated_capacity);
                }
                *(char *)uVar17 = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_358,0,3);
                if (((pointer)local_358._8_8_ == (pointer)0x0) ||
                   (uVar15 = local_358._M_allocated_capacity,
                   ((char *)(local_358._M_allocated_capacity - 1))[local_358._8_8_] != '\\')) {
                  local_308 = CONCAT44(local_308._4_4_,(int)CONCAT71((int7)((ulong)uVar15 >> 8),1));
                  if ((ulong)local_358._8_8_ < (pointer)0x3) {
                    local_310 = (ulong)local_310._4_4_ << 0x20;
                  }
                  else {
                    if (((((char *)(local_358._M_allocated_capacity - 1))[local_358._8_8_] == cVar6)
                        && (((char *)(local_358._M_allocated_capacity - 2))[local_358._8_8_] ==
                            cVar6)) &&
                       (((char *)(local_358._M_allocated_capacity - 3))[local_358._8_8_] == cVar6))
                    {
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_358);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_358);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_358);
                      if (cVar6 == '\"') {
                        detail::remove_escaped_characters(&local_90,(string *)&local_358);
                        from_config();
                      }
                      local_310 = local_310 >> 0x20;
                      local_308 = local_308 & 0xffffffff00000000;
                    }
                    else {
                      local_310 = (ulong)local_310._4_4_;
                    }
                    local_310 = local_310 << 0x20;
                  }
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_358);
                  uVar13 = (undefined7)((ulong)extraout_RAX >> 8);
                  local_310 = CONCAT44(local_310._4_4_,(int)CONCAT71(uVar13,1));
                  local_308 = CONCAT44(local_308._4_4_,(int)CONCAT71(uVar13,1));
                }
                bVar23 = true;
                do {
                  if ((local_308 & 1) == 0) break;
                  local_378._0_8_ = local_378 + 0x10;
                  local_378._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_378._16_8_ = local_378._16_8_ & 0xffffffffffffff00;
                  cVar7 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
                  piVar9 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     (input,(string *)local_378,cVar7);
                  uVar20 = *(uint *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18) + 0x20);
                  if ((uVar20 & 5) == 0) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_330,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_378);
                    local_2c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_330._0_8_ + local_330._8_8_);
                    local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_330._0_8_;
                    ::std::
                    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                              (&local_268,&local_2c8,&local_260);
                    local_330._8_8_ = (long)local_268 - local_330._0_8_;
                    *local_268 = 0;
                    if ((((ulong)local_330._8_8_ < 3) ||
                        (*(char *)(local_330._0_8_ + (local_330._8_8_ - 1)) != cVar6)) ||
                       ((*(char *)(local_330._0_8_ + (local_330._8_8_ - 2)) != cVar6 ||
                        (*(char *)(local_330._0_8_ + (local_330._8_8_ - 3)) != cVar6)))) {
                      if ((local_310 & 1) == 0) {
                        if ((!bVar23) || ((pointer)local_358._8_8_ != (pointer)0x0)) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_358,'\n');
                        }
                      }
                      else {
                        local_2c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)(local_378._0_8_ + local_378._8_8_);
                        local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_378._0_8_;
                        ::std::
                        __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                  (&local_268,&local_2c8,&local_260);
                        local_378._8_8_ = local_268 + -local_378._0_8_;
                        *local_268 = 0;
                        _Var12 = ::std::
                                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                           (local_378._0_8_,
                                            (char *)(local_378._0_8_ +
                                                    (long)&((pointer)local_378._8_8_)->_M_dataplus))
                        ;
                        if ((char *)(local_378._0_8_ + local_378._8_8_) == _Var12._M_current) {
                          local_378._8_8_ =
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x0;
                          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_378._0_8_;
                        }
                        else {
                          pbVar16 = (pointer)(_Var12._M_current + -local_378._0_8_);
                          if (((pointer)local_378._8_8_ != pbVar16 && pbVar16 != (pointer)0x0) &&
                             (sVar19 = local_378._8_8_ - (long)pbVar16, sVar19 != 0)) {
                            if (sVar19 == 1) {
                              *(char *)local_378._0_8_ = *(char *)(local_378._0_8_ + (long)pbVar16);
                            }
                            else {
                              memmove((void *)local_378._0_8_,
                                      (char *)(local_378._0_8_ + (long)pbVar16),sVar19);
                            }
                          }
                          local_378._8_8_ = local_378._8_8_ - (long)pbVar16;
                          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_378._0_8_ + local_378._8_8_);
                        }
                        *(char *)&(pbVar18->_M_dataplus)._M_p = '\0';
                      }
                      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_378._8_8_ ==
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0) || (((char *)(local_378._0_8_ + -1))[local_378._8_8_] != '\\')) {
                        local_310 = local_310 & 0xffffffff00000000;
                      }
                      else {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_378);
                        local_310 = CONCAT44(local_310._4_4_,
                                             (int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1));
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_358,(char *)local_378._0_8_,local_378._8_8_);
                      bVar23 = false;
                    }
                    else {
                      local_254 = uVar20;
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_330);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_330);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_330);
                      if ((local_310 & 1) == 0) {
                        if ((!bVar23) || ((pointer)local_358._8_8_ != (pointer)0x0)) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_358,'\n');
                        }
                      }
                      else {
                        _Var12 = ::std::
                                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                           (local_330._0_8_,
                                            (char *)(local_330._0_8_ + local_330._8_8_));
                        if ((char *)(local_330._0_8_ + local_330._8_8_) == _Var12._M_current) {
                          local_330._8_8_ = 0;
                          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_330._0_8_;
                        }
                        else {
                          uVar21 = (long)_Var12._M_current - local_330._0_8_;
                          if ((local_330._8_8_ != uVar21 && uVar21 != 0) &&
                             (sVar19 = local_330._8_8_ - uVar21, sVar19 != 0)) {
                            if (sVar19 == 1) {
                              *(char *)local_330._0_8_ = *(char *)(local_330._0_8_ + uVar21);
                            }
                            else {
                              memmove((void *)local_330._0_8_,(char *)(local_330._0_8_ + uVar21),
                                      sVar19);
                            }
                          }
                          local_330._8_8_ = local_330._8_8_ - uVar21;
                          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_330._0_8_ + local_330._8_8_);
                        }
                        *(char *)&(pbVar18->_M_dataplus)._M_p = '\0';
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_358,(char *)local_330._0_8_,local_330._8_8_);
                      if (((pointer)local_358._8_8_ != (pointer)0x0) &&
                         (((char *)(local_358._M_allocated_capacity - 1))[local_358._8_8_] == '\n'))
                      {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_358);
                      }
                      if (cVar6 == '\"') {
                        detail::remove_escaped_characters(local_d0,(string *)&local_358);
                        from_config();
                      }
                      bVar23 = false;
                      local_308 = local_308 & 0xffffffff00000000;
                      uVar20 = local_254;
                    }
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_378._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_378 + 0x10)) {
                    operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
                  }
                } while ((uVar20 & 5) == 0);
                local_378._0_8_ = local_378 + 0x10;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_378,local_358._M_allocated_capacity,
                           (char *)(local_358._8_8_ + local_358._M_allocated_capacity));
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_2f8,local_378,&local_358);
LAB_00196ae5:
                uVar15 = local_378._16_8_;
                uVar17 = local_378._0_8_;
                pCVar22 = local_338;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_378 + 0x10)) {
LAB_00196af8:
                  operator_delete((void *)uVar17,
                                  (ulong)((long)&(((pointer)uVar15)->_M_dataplus)._M_p + 1));
                }
              }
              else {
                if (((ulong)local_358._8_8_ < (pointer)0x2) ||
                   (local_22c != (int)*(char *)local_358._M_allocated_capacity)) {
                  if ((local_2fc & 1) != 0) {
                    if (((pointer)local_358._8_8_ == (pointer)0x0) ||
                       (pvVar11 = memchr((void *)local_358._M_allocated_capacity,local_2dc,
                                         local_358._8_8_),
                       (long)pvVar11 - uVar15 == -1 || pvVar11 == (void *)0x0)) {
                      uVar15 = local_358._M_allocated_capacity;
                      if (((~(byte)local_2fc & 1) != 0 || (pointer)uVar17 == (pointer)0x0) ||
                         (pvVar11 = memchr((void *)local_358._M_allocated_capacity,0x20,uVar17),
                         (long)pvVar11 - uVar15 == -1 || pvVar11 == (void *)0x0)) goto LAB_00196a9f;
                      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_1e8,local_358._M_allocated_capacity,
                                 (char *)(uVar17 + local_358._M_allocated_capacity));
                      detail::split_up(&local_2c8,&local_1e8,'\0');
                      local_378._16_8_ =
                           local_2f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      local_378._8_8_ =
                           local_2f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      local_378._0_8_ =
                           local_2f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      pCVar22 = local_338;
                      local_2f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      local_2f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      local_2f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      local_2c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_2c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_2c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_378);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_2c8);
                      uVar15 = local_1e8.field_2._M_allocated_capacity;
                      uVar17 = local_1e8._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) goto LAB_00196af8;
                    }
                    else {
                      local_1c8._M_allocated_capacity = (size_type)&local_1b8;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_1c8,local_358._M_allocated_capacity,
                                 (char *)(uVar17 + local_358._M_allocated_capacity));
                      detail::split_up(&local_2c8,(string *)&local_1c8,(char)local_2dc);
                      local_378._16_8_ =
                           local_2f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      local_378._8_8_ =
                           local_2f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      local_378._0_8_ =
                           local_2f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      pCVar22 = local_338;
                      local_2f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      local_2f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      local_2f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      local_2c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_2c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_2c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_378);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_2c8);
                      uVar15 = local_1b8._M_allocated_capacity;
                      uVar17 = local_1c8._M_allocated_capacity;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c8._M_allocated_capacity != &local_1b8) goto LAB_00196af8;
                    }
                    goto LAB_00196b00;
                  }
LAB_00196a9f:
                  local_378._0_8_ = local_378 + 0x10;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_378,local_358._M_allocated_capacity,
                             (char *)(uVar17 + local_358._M_allocated_capacity));
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_assign_aux<std::__cxx11::string_const*>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_2f8,local_378,&local_358);
                  goto LAB_00196ae5;
                }
                local_378._0_8_ = local_378 + 0x10;
                local_378._8_8_ = (pointer)0x0;
                local_378._16_8_ = local_378._16_8_ & 0xffffffffffffff00;
                while (local_2d4 != ((char *)(local_358._M_allocated_capacity - 1))[local_358._8_8_]
                      ) {
                  cVar6 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
                  piVar9 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     (input,(string *)local_378,cVar6);
                  if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
                  local_2c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)(local_378._0_8_ + (long)(_Alloc_hider *)local_378._8_8_);
                  local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_378._0_8_;
                  ::std::
                  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                            (&local_268,&local_2c8,&local_260);
                  local_378._8_8_ = local_268 + -local_378._0_8_;
                  *local_268 = 0;
                  _Var12 = ::std::
                           __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                     (local_378._0_8_,
                                      (char *)(local_378._0_8_ +
                                              (long)&((pointer)local_378._8_8_)->_M_dataplus));
                  if ((char *)(local_378._0_8_ + local_378._8_8_) == _Var12._M_current) {
                    local_378._8_8_ = (pointer)0x0;
                    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_378._0_8_;
                  }
                  else {
                    pbVar16 = (pointer)(_Var12._M_current + -local_378._0_8_);
                    if (((pointer)local_378._8_8_ != pbVar16 && pbVar16 != (pointer)0x0) &&
                       (sVar19 = local_378._8_8_ - (long)pbVar16, sVar19 != 0)) {
                      if (sVar19 == 1) {
                        *(char *)local_378._0_8_ = *(char *)(local_378._0_8_ + (long)pbVar16);
                      }
                      else {
                        memmove((void *)local_378._0_8_,(char *)(local_378._0_8_ + (long)pbVar16),
                                sVar19);
                      }
                    }
                    local_378._8_8_ = local_378._8_8_ - (long)pbVar16;
                    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_378._0_8_ + (long)&((pointer)local_378._8_8_)->_M_dataplus);
                  }
                  *(char *)&(pbVar18->_M_dataplus)._M_p = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_358,(char *)local_378._0_8_,local_378._8_8_);
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_378._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_378 + 0x10)) {
                  operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
                }
                pCVar22 = local_338;
                if (local_2d4 == ((char *)(local_358._M_allocated_capacity - 1))[local_358._8_8_]) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_358,1,(size_type)(local_358._8_8_ + -2));
                  detail::split_up(&local_2c8,(string *)&local_148,(char)local_2dc);
                  local_378._16_8_ =
                       local_2f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_378._8_8_ =
                       local_2f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_378._0_8_ =
                       local_2f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_2f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       local_2c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_2f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_2c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       local_2c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_2c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_2c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_378);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_2c8);
                  uVar15 = local_138._M_allocated_capacity;
                  uVar17 = local_148._M_allocated_capacity;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_148._M_allocated_capacity == &local_138) goto LAB_00196b00;
                  goto LAB_00196af8;
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_358,1,0xffffffffffffffff);
                detail::split_up(&local_2c8,&local_168,(char)local_2dc);
                local_378._16_8_ =
                     local_2f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_378._8_8_ =
                     local_2f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_378._0_8_ =
                     local_2f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_2c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_2c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_2c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_2c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_2c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_378);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2c8);
                uVar15 = local_168.field_2._M_allocated_capacity;
                uVar17 = local_168._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_00196af8;
              }
LAB_00196b00:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_allocated_capacity != &local_348) {
                operator_delete((void *)local_358._M_allocated_capacity,
                                (ulong)(local_348._M_allocated_capacity + 1));
              }
            }
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_378._8_8_ = (pointer)0x0;
            local_378._16_8_ = (pointer)0x0;
            detail::generate_parents(&local_2c8,&local_2a8,&local_288,pCVar22->parentSeparatorChar);
            local_348._M_allocated_capacity = local_378._16_8_;
            local_358._8_8_ = local_378._8_8_;
            local_358._M_allocated_capacity = local_378._0_8_;
            local_378._0_8_ =
                 local_2c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_378._8_8_ =
                 local_2c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_378._16_8_ =
                 local_2c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_358);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_2c8);
            detail::process_quoted_string(&local_288,'\"','\'');
            pbVar16 = local_2f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (str = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_2f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; uVar15 = local_378._0_8_,
                str != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)pbVar16; str = str + 2) {
              detail::process_quoted_string
                        ((string *)str,local_338->stringQuote,local_338->literalQuote);
            }
            if ((ulong)((long)(local_378._8_8_ - local_378._0_8_) >> 5) <=
                (ulong)local_338->maximumLayers) {
              sVar19 = (local_338->configSection)._M_string_length;
              if ((sVar19 == 0) || ((local_2d8 & 1) != 0)) {
LAB_00196c1f:
                pCVar3 = (local_2d0->
                         super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                if (((((local_2d0->
                       super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                       _M_impl.super__Vector_impl_data._M_start == pCVar3) ||
                     (local_288._M_string_length != pCVar3[-1].name._M_string_length)) ||
                    ((local_288._M_string_length != 0 &&
                     (iVar8 = bcmp(local_288._M_dataplus._M_p,pCVar3[-1].name._M_dataplus._M_p,
                                   local_288._M_string_length), iVar8 != 0)))) ||
                   ((pbVar18 = pCVar3[-1].parents.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                    local_378._8_8_ - local_378._0_8_ !=
                    (long)pCVar3[-1].parents.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 ||
                    (bVar23 = ::std::__equal<false>::
                              equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_378._0_8_,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_378._8_8_,pbVar18), !bVar23)))) {
                  pvVar5 = local_2d0;
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                            (local_2d0);
                  pCVar3 = (pvVar5->
                           super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                  local_358._M_allocated_capacity =
                       (size_type)
                       pCVar3[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_358._8_8_ =
                       pCVar3[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_348._M_allocated_capacity =
                       (size_type)
                       pCVar3[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pCVar3[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_378._0_8_;
                  pCVar3[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_378._8_8_;
                  pCVar3[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_378._16_8_;
                  local_378._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_378._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_378._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_358);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&(pvVar5->
                             super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                             _M_impl.super__Vector_impl_data._M_finish[-1].name,&local_288);
                  pCVar3 = (pvVar5->
                           super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                  local_358._M_allocated_capacity =
                       (size_type)
                       pCVar3[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_358._8_8_ =
                       pCVar3[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_348._M_allocated_capacity =
                       (size_type)
                       pCVar3[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pCVar3[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       local_2f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  pCVar3[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_2f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  pCVar3[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       local_2f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_2f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_2f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_358);
                }
                else {
                  pCVar3 = (local_2d0->
                           super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pCVar3[-1].inputs,
                             pCVar3[-1].inputs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             local_2f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_2f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
              }
              else if (((local_378._0_8_ != local_378._8_8_) &&
                       (__n = *(size_type *)(local_378._0_8_ + 8), __n == sVar19)) &&
                      ((__n == 0 ||
                       (iVar8 = bcmp(((_Alloc_hider *)local_378._0_8_)->_M_p,
                                     (local_338->configSection)._M_dataplus._M_p,__n), iVar8 == 0)))
                      ) {
                sVar2 = local_338->configIndex;
                if (local_2ac == sVar2 || sVar2 < 0) {
                  local_2d8 = (uint)CONCAT71((uint7)(uint3)(int3)(char)((ushort)sVar2 >> 8),1);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_378,(iterator)uVar15);
                  goto LAB_00196c1f;
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_378);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // mutliline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        if(!output.empty() && name == output.back().name && parents == output.back().parents) {
            output.back().inputs.insert(output.back().inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}